

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

bool __thiscall chatra::Thread::initializeVars(Thread *this)

{
  pointer pFVar1;
  pointer ppVar2;
  pointer ppTVar3;
  TemporaryObject *argsValue;
  pointer pFVar4;
  ObjectBase *pOVar5;
  _func_int **pp_Var6;
  Class *cl;
  Thread *this_00;
  Thread *thread;
  Reference RVar7;
  NativeMethod *pNVar8;
  pthread_t pVar9;
  Method *pMVar10;
  TemporaryObject *pTVar11;
  Tuple **ppTVar12;
  size_t sVar13;
  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
  __tmp;
  _func_int *p_Var14;
  int local_78 [6];
  Node *local_60 [4];
  Thread *local_40;
  
  pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar2 = pFVar1[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (ppVar2[-1].second == 0) {
    ppVar2[-1].second = 1;
    Lock::prepareToMethodCall(pFVar1[-1].lock);
    pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pp_Var6 = ((pFVar1[-4].values.
                super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->targetRef).node)->object[1].
              _vptr_Object;
    RVar7 = Frame::getSelf(pFVar1 + -2);
    this_00 = local_40;
    for (p_Var14 = pp_Var6[8]; thread = local_40, p_Var14 != pp_Var6[7]; p_Var14 = p_Var14 + -8) {
      cl = *(Class **)(p_Var14 + -8);
      local_60[0] = (Node *)popValueNode;
      local_78[0] = 0;
      std::
      vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
      ::emplace_back<chatra::Node*,int>
                ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                  *)&(this_00->frames).
                     super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].stack,local_60,local_78);
      constructFrames(this_00,cl->package,cl->node,cl,RVar7);
    }
    checkTransferReq(local_40);
    RuntimeImp::enqueue(thread->runtime,thread);
  }
  else {
    pFVar1[-1].stack.
    super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2 + -1;
    pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ppTVar3 = pFVar1[-4].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    argsValue = ppTVar3[-3];
    pTVar11 = ppTVar3[-2];
    pFVar4 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_start;
    RVar7 = Frame::getSelf(pFVar1 + -2);
    pOVar5 = (ObjectBase *)(RVar7.node)->object;
    pNVar8 = TemporaryObject::getNativeMethod(pTVar11);
    if (pNVar8 == (NativeMethod *)0x0) {
      pMVar10 = TemporaryObject::getRefMethod(pTVar11);
      importMethodArguments(this,pMVar10,argsValue,(TemporaryObject *)0x0);
      return true;
    }
    pVar9 = pthread_self();
    (this->nativeCallThreadId)._M_thread = pVar9;
    SpinLock::lock(&this->lockNative);
    pMVar10 = TemporaryObject::getRefMethod(pTVar11);
    sVar13 = ((long)pFVar1 - (long)pFVar4) / 0x110 - 4;
    pTVar11 = Frame::pushTemporary
                        ((this->frames).
                         super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                         super__Vector_impl_data._M_start + sVar13);
    RVar7 = TemporaryObject::setRvalue(pTVar11);
    this->callerFrame = sVar13;
    this->pauseRequested = false;
    if (argsValue == (TemporaryObject *)0x0) {
      ppTVar12 = &this->emptyTuple;
    }
    else {
      ppTVar12 = (Tuple **)&((argsValue->targetRef).node)->object;
    }
    (*pNVar8->method)(pNVar8->handler,this,pOVar5,pMVar10->name,pMVar10->subName,*ppTVar12,
                      (Reference)RVar7.node);
    (this->nativeCallThreadId)._M_thread = 0;
    pop(this);
    if (this->pauseRequested == true) {
      pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      Lock::prepareToMethodCall(pFVar1[-1].lock);
      checkTransferReq(this);
      if (pFVar1[-1].stack.
          super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pFVar1[-1].stack.
          super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_60[0] = (Node *)restoreTemporaryLockNode;
        local_78[0] = 0;
        std::
        vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
        ::emplace_back<chatra::Node*,int>
                  ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                    *)&pFVar1[-1].stack,local_60,local_78);
      }
    }
    else {
      RuntimeImp::enqueue(this->runtime,this);
    }
    (this->lockNative).flag.super___atomic_flag_base._M_i = false;
  }
  return false;
}

Assistant:

bool Thread::initializeVars() {
	constexpr size_t callFrameCount = 3;
	auto& nodePhase = frames.back().stack.back().second;

	switch (nodePhase) {
	case 0: {
		nodePhase++;
		frames.back().lock->prepareToMethodCall();

		auto& initializationOrder = (frames.end() - callFrameCount - 1)->values.back()->getRef().deref<ObjectBase>().getClass()->refInitializationOrder();
		auto ref = (frames.end() - 2)->getSelf();
		for (auto it = initializationOrder.crbegin(); it != initializationOrder.crend(); it++) {
			auto* cl = *it;
			frames.back().stack.emplace_back(&popValueNode, 0);
			constructFrames(cl->getPackage(), cl->getNode(), cl, ref);
		}

		checkTransferReq();
		runtime.enqueue(this);
		return false;
	}

	default: {
		frames.back().stack.pop_back();
		auto& f0 = *(frames.end() - callFrameCount - 1);
		auto* methodValue = *(f0.values.end() - 2);
		auto* argsValue = *(f0.values.end() - 3);

		auto isNative = invokeNativeMethod(frames.size() - callFrameCount - 1, &(frames.end() - 2)->getSelf().deref<ObjectBase>(),
				methodValue, argsValue, [&]() { pop(); });
		if (isNative)
			return false;

		importMethodArguments(methodValue->getRefMethod(), argsValue);
		return true;
	}
	}
}